

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

int decode_hex4(char *hex)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int digit [4];
  
  lVar2 = 0;
  while( true ) {
    bVar1 = hex[lVar2];
    if ((byte)(bVar1 - 0x30) < 10) {
      iVar3 = bVar1 - 0x30;
    }
    else {
      iVar3 = -1;
      if ((byte)((bVar1 | 0x20) + 0x9f) < 6) {
        iVar3 = (bVar1 | 0x20) - 0x57;
      }
    }
    digit[lVar2] = iVar3;
    if (iVar3 < 0) break;
    lVar2 = lVar2 + 1;
    if (lVar2 == 4) {
      return digit[2] * 0x10 + digit[1] * 0x100 + digit[0] * 0x1000 + digit[3];
    }
  }
  return -1;
}

Assistant:

static int decode_hex4(const char *hex)
{
    int digit[4];
    int i;

    /* Convert ASCII hex digit to numeric digit
     * Note: this returns an error for invalid hex digits, including
     *       NULL */
    for (i = 0; i < 4; i++) {
        digit[i] = hexdigit2int(hex[i]);
        if (digit[i] < 0) {
            return -1;
        }
    }

    return (digit[0] << 12) +
           (digit[1] << 8) +
           (digit[2] << 4) +
            digit[3];
}